

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

string * util::toUpper(string *__return_storage_ptr__,string *in)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)in->_M_string_length);
  sVar1 = in->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (in->_M_dataplus)._M_p;
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = toupper((int)pcVar2[sVar5]);
      pcVar3[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpper(const std::string& in) {
  std::string out;
  out.resize(in.size());
  std::transform(in.begin(), in.end(), out.begin(), ::toupper);
  return out;
}